

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

transformation_t *
opengv::point_cloud::threept_arun
          (transformation_t *__return_storage_ptr__,PointCloudAdapterBase *adapter,Indices *indices)

{
  long *plVar1;
  undefined8 *puVar2;
  double dVar3;
  size_t sVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  ulong uVar16;
  double *pdVar17;
  Index outer;
  ulong uVar18;
  int iVar19;
  size_t sVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar31 [16];
  double dVar32;
  MatrixXd Hcross;
  rotation_t rotation;
  Vector3d f;
  double local_118;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  double local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  long lStack_88;
  double local_80;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  double local_38;
  
  auVar31 = in_ZMM1._0_16_;
  sVar4 = indices->_numberCorrespondences;
  if (sVar4 == 0) {
    local_118 = 0.0;
    local_c8 = 0.0;
    local_e8 = ZEXT816(0);
    local_d8 = ZEXT816(0);
  }
  else {
    local_d8 = ZEXT816(0);
    local_c8 = 0.0;
    lVar23 = 0;
    local_118 = 0.0;
    sVar20 = 0;
    local_e8 = ZEXT816(0);
    do {
      iVar19 = (int)sVar20;
      iVar22 = iVar19;
      if (indices->_useIndices != false) {
        iVar22 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar23 >> 0x1e));
      }
      (*adapter->_vptr_PointCloudAdapterBase[2])(local_a8,adapter,(long)iVar22);
      if (indices->_useIndices != false) {
        iVar19 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar23 >> 0x1e));
      }
      local_d8._8_8_ = (double)local_d8._8_8_ + (double)local_a8._8_8_;
      local_d8._0_8_ = (double)local_d8._0_8_ + (double)local_a8._0_8_;
      local_118 = local_118 + (double)local_a8._16_8_;
      (*adapter->_vptr_PointCloudAdapterBase[3])(local_a8,adapter,(long)iVar19);
      auVar31 = in_ZMM1._0_16_;
      local_e8._8_8_ = (double)local_e8._8_8_ + (double)local_a8._8_8_;
      local_e8._0_8_ = (double)local_e8._0_8_ + (double)local_a8._0_8_;
      local_c8 = local_c8 + (double)local_a8._16_8_;
      sVar20 = sVar20 + 1;
      lVar23 = lVar23 + 0x100000000;
    } while (sVar4 != sVar20);
  }
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  local_108.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,9,3,3);
  if ((local_108.m_rows != 3) || (local_108.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,9,3,3);
  }
  local_58 = vcvtusi2sd_avx512f(auVar31,sVar4);
  uVar21 = local_108.m_rows * local_108.m_cols;
  uVar18 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar18 = uVar21;
  }
  uVar24 = uVar18 & 0xfffffffffffffff8;
  pdVar17 = local_108.m_data;
  if (7 < (long)uVar21) {
    uVar16 = 8;
    if (8 < (long)uVar24) {
      uVar16 = uVar24;
    }
    local_b8._0_8_ = local_108.m_data;
    memset(local_108.m_data,0,uVar16 * 8);
    pdVar17 = (double *)local_b8._0_8_;
  }
  auVar31._8_8_ = local_58._0_8_;
  auVar31._0_8_ = local_58._0_8_;
  dVar13 = (double)local_58._0_8_;
  if ((long)uVar24 < (long)uVar21) {
    local_b8 = auVar31;
    memset(pdVar17 + ((long)uVar18 >> 3) * 8,0,uVar21 * 8 + ((long)uVar18 >> 3) * -0x40);
    auVar31 = local_b8;
    dVar13 = (double)local_58._0_8_;
  }
  local_d8 = vdivpd_avx(local_d8,auVar31);
  local_e8 = vdivpd_avx(local_e8,auVar31);
  local_c8 = local_c8 / dVar13;
  uStack_c0 = 0;
  if (sVar4 != 0) {
    sVar20 = 0;
    do {
      iVar22 = (int)sVar20;
      iVar19 = iVar22;
      if (indices->_useIndices == true) {
        iVar19 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      (*adapter->_vptr_PointCloudAdapterBase[2])(local_a8,adapter,(long)iVar19);
      auVar12._8_8_ = local_a8._8_8_;
      auVar12._0_8_ = local_a8._0_8_;
      local_48 = vsubpd_avx(auVar12,local_d8);
      local_38 = (double)local_a8._16_8_ - local_118 / dVar13;
      if (indices->_useIndices == true) {
        iVar22 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
      }
      (*adapter->_vptr_PointCloudAdapterBase[3])(local_a8,adapter,(long)iVar22);
      auVar15._8_8_ = local_a8._8_8_;
      auVar15._0_8_ = local_a8._0_8_;
      auVar31 = vsubpd_avx(auVar15,local_e8);
      dVar32 = (double)local_a8._16_8_ - local_c8;
      lVar23 = 0;
      pdVar17 = (double *)(local_a8 + 0x10);
      do {
        dVar3 = *(double *)(local_48 + lVar23 * 8);
        pdVar17[-2] = auVar31._0_8_ * dVar3;
        pdVar17[-1] = auVar31._8_8_ * dVar3;
        *pdVar17 = dVar32 * dVar3;
        lVar23 = lVar23 + 1;
        pdVar17 = pdVar17 + 3;
      } while (lVar23 != 3);
      uVar21 = local_108.m_cols * local_108.m_rows;
      uVar18 = uVar21 + 7;
      if (-1 < (long)uVar21) {
        uVar18 = uVar21;
      }
      if (7 < (long)uVar21) {
        lVar23 = 0;
        do {
          auVar25 = vaddpd_avx512f(*(undefined1 (*) [64])(local_a8 + lVar23 * 8),
                                   *(undefined1 (*) [64])(local_108.m_data + lVar23));
          *(undefined1 (*) [64])(local_108.m_data + lVar23) = auVar25;
          lVar23 = lVar23 + 8;
        } while (lVar23 < (long)(uVar18 & 0xfffffffffffffff8));
      }
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if ((long)uVar21 % 8 != 0 && (long)(uVar18 & 0xfffffffffffffff8) <= (long)uVar21) {
        lVar23 = (long)uVar18 >> 3;
        auVar26 = vpbroadcastq_avx512f();
        uVar18 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar27,auVar25);
          uVar24 = vpcmpuq_avx512f(auVar27,auVar26,2);
          plVar1 = (long *)(local_a8 + uVar18 * 8 + lVar23 * 0x40);
          bVar5 = (byte)uVar24;
          auVar27._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * plVar1[1];
          auVar27._0_8_ = (ulong)(bVar5 & 1) * *plVar1;
          auVar27._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * plVar1[2];
          auVar27._24_8_ = (ulong)((byte)(uVar24 >> 3) & 1) * plVar1[3];
          auVar27._32_8_ = (ulong)((byte)(uVar24 >> 4) & 1) * plVar1[4];
          auVar27._40_8_ = (ulong)((byte)(uVar24 >> 5) & 1) * plVar1[5];
          auVar27._48_8_ = (ulong)((byte)(uVar24 >> 6) & 1) * plVar1[6];
          auVar27._56_8_ = (uVar24 >> 7) * plVar1[7];
          pdVar17 = local_108.m_data + lVar23 * 8 + uVar18;
          auVar28._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * (long)pdVar17[1];
          auVar28._0_8_ = (ulong)(bVar5 & 1) * (long)*pdVar17;
          auVar28._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * (long)pdVar17[2];
          auVar28._24_8_ = (ulong)((byte)(uVar24 >> 3) & 1) * (long)pdVar17[3];
          auVar28._32_8_ = (ulong)((byte)(uVar24 >> 4) & 1) * (long)pdVar17[4];
          auVar28._40_8_ = (ulong)((byte)(uVar24 >> 5) & 1) * (long)pdVar17[5];
          auVar28._48_8_ = (ulong)((byte)(uVar24 >> 6) & 1) * (long)pdVar17[6];
          auVar28._56_8_ = (uVar24 >> 7) * (long)pdVar17[7];
          auVar27 = vaddpd_avx512f(auVar27,auVar28);
          pdVar17 = local_108.m_data + lVar23 * 8 + uVar18;
          bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar24 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar24 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar24 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar24 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar24 >> 6) & 1);
          *pdVar17 = (double)((ulong)(bVar5 & 1) * auVar27._0_8_ |
                             (ulong)!(bool)(bVar5 & 1) * (long)*pdVar17);
          pdVar17[1] = (double)((ulong)bVar6 * auVar27._8_8_ | (ulong)!bVar6 * (long)pdVar17[1]);
          pdVar17[2] = (double)((ulong)bVar7 * auVar27._16_8_ | (ulong)!bVar7 * (long)pdVar17[2]);
          pdVar17[3] = (double)((ulong)bVar8 * auVar27._24_8_ | (ulong)!bVar8 * (long)pdVar17[3]);
          pdVar17[4] = (double)((ulong)bVar9 * auVar27._32_8_ | (ulong)!bVar9 * (long)pdVar17[4]);
          pdVar17[5] = (double)((ulong)bVar10 * auVar27._40_8_ | (ulong)!bVar10 * (long)pdVar17[5]);
          pdVar17[6] = (double)((ulong)bVar11 * auVar27._48_8_ | (ulong)!bVar11 * (long)pdVar17[6]);
          pdVar17[7] = (double)((uVar24 >> 7) * auVar27._56_8_ |
                               (ulong)!SUB81(uVar24 >> 7,0) * (long)pdVar17[7]);
          uVar18 = uVar18 + 8;
        } while (((long)uVar21 % 8 + 7U & 0xfffffffffffffff8) != uVar18);
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 != sVar4);
  }
  math::arun((rotation_t *)local_a8,(MatrixXd *)&local_108);
  dVar32 = local_e8._0_8_;
  auVar29._0_8_ = dVar32 * (double)local_a8._0_8_;
  auVar29._8_8_ = dVar32 * (double)local_a8._8_8_;
  auVar31 = vshufpd_avx(local_e8,local_e8,1);
  auVar12 = vshufpd_avx(local_e8,local_e8,3);
  auVar12 = vfmadd132pd_fma(auVar12,auVar29,stack0xffffffffffffff70);
  auVar30._8_8_ = local_c8;
  auVar30._0_8_ = local_c8;
  auVar12 = vfmadd132pd_fma(auVar30,auVar12,local_78);
  lVar23 = 0x10;
  do {
    uVar14 = *(undefined8 *)(local_b8 + lVar23 + 8);
    puVar2 = (undefined8 *)
             ((long)(__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.
                    array + lVar23 + -0x10);
    *puVar2 = *(undefined8 *)(local_b8 + lVar23);
    puVar2[1] = uVar14;
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
            m_storage.m_data.array + lVar23) = *(undefined8 *)(local_a8 + lVar23);
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x58);
  auVar12 = vsubpd_avx(local_d8,auVar12);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array + 9) = auVar12;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
  m_data.array[0xb] =
       local_118 / dVar13 -
       (dVar32 * (double)local_a8._16_8_ + auVar31._0_8_ * local_80 + local_c8 * local_68);
  if (local_108.m_data != (double *)0x0) {
    free((void *)local_108.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

transformation_t threept_arun(
    const PointCloudAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  //derive the centroid of the two point-clouds
  point_t pointsCenter1 = Eigen::Vector3d::Zero();
  point_t pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getPoint1(indices[i]);
    pointsCenter2 += adapter.getPoint2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  //compute the matrix H = sum(f'*f^{T})
  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getPoint1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getPoint2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  //decompose this matrix (SVD) to obtain rotation
  rotation_t rotation = math::arun(Hcross);
  translation_t translation = pointsCenter1 - rotation*pointsCenter2;
  transformation_t solution;
  solution.block<3,3>(0,0) = rotation;
  solution.col(3) = translation;

  return solution;
}